

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O3

bool r_exec::sub(Context *context,uint16_t *index)

{
  bool bVar1;
  char cVar2;
  uint16_t uVar3;
  int iVar4;
  undefined4 extraout_var;
  long *plVar6;
  undefined4 extraout_var_00;
  long *plVar7;
  Atom *pAVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  float fVar13;
  undefined4 extraout_XMM0_Db;
  Atom local_5c [4];
  Atom local_58 [4];
  Atom local_54 [4];
  Atom local_50 [4];
  Atom local_4c [4];
  float local_48;
  undefined4 uStack_44;
  long *plVar5;
  
  iVar4 = (*context->implementation->_vptr__Context[7])(context->implementation,1);
  plVar5 = (long *)CONCAT44(extraout_var,iVar4);
  plVar6 = (long *)(**(code **)(*plVar5 + 0x40))(plVar5);
  (**(code **)(*plVar5 + 8))(plVar5);
  iVar4 = (*context->implementation->_vptr__Context[7])(context->implementation,2);
  plVar5 = (long *)CONCAT44(extraout_var_00,iVar4);
  plVar7 = (long *)(**(code **)(*plVar5 + 0x40))(plVar5);
  (**(code **)(*plVar5 + 8))(plVar5);
  (**(code **)(*plVar6 + 0x20))(plVar6,0);
  cVar2 = r_code::Atom::isFloat();
  if (cVar2 == '\0') {
    (**(code **)(*plVar6 + 0x20))(plVar6,0);
    cVar2 = r_code::Atom::getDescriptor();
    if (cVar2 == -0x39) {
      (**(code **)(*plVar7 + 0x20))(plVar7,0);
      cVar2 = r_code::Atom::getDescriptor();
      if (cVar2 == -0x39) {
        pAVar8 = (Atom *)(**(code **)(*plVar6 + 0x20))(plVar6,0);
        lVar9 = r_code::Utils::GetTimestamp(pAVar8);
        pAVar8 = (Atom *)(**(code **)(*plVar7 + 0x20))(plVar7,0);
        lVar10 = r_code::Utils::GetTimestamp(pAVar8);
        uVar3 = _Context::setTimestampResult(context->implementation,lVar9 - lVar10);
LAB_0018e13f:
        *index = uVar3;
        goto LAB_0018e2a9;
      }
      (**(code **)(*plVar7 + 0x20))(plVar7,0);
      cVar2 = r_code::Atom::isFloat();
      if (cVar2 != '\0') {
        pAVar8 = (Atom *)(**(code **)(*plVar7 + 0x20))(plVar7,0);
        r_code::Atom::PlusInfinity();
        cVar2 = r_code::Atom::operator!=(pAVar8,local_5c);
        r_code::Atom::~Atom(local_5c);
        if (cVar2 != '\0') {
          pAVar8 = (Atom *)(**(code **)(*plVar6 + 0x20))(plVar6,0);
          uVar11 = r_code::Utils::GetTimestamp(pAVar8);
          local_48 = (float)uVar11;
          uStack_44 = extraout_XMM0_Db;
          (**(code **)(*plVar7 + 0x20))(plVar7,0);
          fVar13 = (float)r_code::Atom::asFloat();
          uVar11 = (ulong)(local_48 - fVar13);
          uVar3 = _Context::setTimestampResult
                            (context->implementation,
                             (long)((local_48 - fVar13) - 9.223372e+18) & (long)uVar11 >> 0x3f |
                             uVar11);
          goto LAB_0018e13f;
        }
      }
    }
LAB_0018e1bb:
    r_code::Atom::Nil();
    uVar3 = Context::setAtomicResult(context,local_58);
    *index = uVar3;
    r_code::Atom::~Atom(local_58);
    bVar12 = false;
    bVar1 = false;
    if (plVar7 == (long *)0x0) goto LAB_0018e2b5;
  }
  else {
    (**(code **)(*plVar7 + 0x20))(plVar7,0);
    cVar2 = r_code::Atom::isFloat();
    if (cVar2 == '\0') goto LAB_0018e1bb;
    pAVar8 = (Atom *)(**(code **)(*plVar6 + 0x20))(plVar6,0);
    r_code::Atom::PlusInfinity();
    cVar2 = r_code::Atom::operator==(pAVar8,local_5c);
    r_code::Atom::~Atom(local_5c);
    if (cVar2 == '\0') {
      pAVar8 = (Atom *)(**(code **)(*plVar7 + 0x20))(plVar7,0);
      r_code::Atom::PlusInfinity();
      cVar2 = r_code::Atom::operator==(pAVar8,local_5c);
      r_code::Atom::~Atom(local_5c);
      if (cVar2 == '\0') {
        (**(code **)(*plVar6 + 0x20))(plVar6,0);
        local_48 = (float)r_code::Atom::asFloat();
        (**(code **)(*plVar7 + 0x20))(plVar7,0);
        fVar13 = (float)r_code::Atom::asFloat();
        r_code::Atom::Float(local_48 - fVar13);
        uVar3 = Context::setAtomicResult(context,local_54);
        *index = uVar3;
        pAVar8 = local_54;
      }
      else {
        r_code::Atom::Float(0.0);
        uVar3 = Context::setAtomicResult(context,local_50);
        *index = uVar3;
        pAVar8 = local_50;
      }
    }
    else {
      r_code::Atom::PlusInfinity();
      uVar3 = Context::setAtomicResult(context,local_4c);
      *index = uVar3;
      pAVar8 = local_4c;
    }
    r_code::Atom::~Atom(pAVar8);
LAB_0018e2a9:
    bVar1 = true;
  }
  bVar12 = bVar1;
  (**(code **)(*plVar7 + 8))(plVar7);
LAB_0018e2b5:
  (**(code **)(*plVar6 + 8))(plVar6);
  return bVar12;
}

Assistant:

bool sub(const Context &context, uint16_t &index)
{
    Context lhs = *context.getChild(1);
    Context rhs = *context.getChild(2);

    if (lhs[0].isFloat()) {
        if (rhs[0].isFloat()) {
            if (lhs[0] == Atom::PlusInfinity()) {
                index = context.setAtomicResult(Atom::PlusInfinity());
                return true;
            }

            if (rhs[0] == Atom::PlusInfinity()) {
                index = context.setAtomicResult(Atom::Float(0));
                return true;
            }

            index = context.setAtomicResult(Atom::Float(lhs[0].asFloat() - rhs[0].asFloat()));
            return true;
        }
    } else if (lhs[0].getDescriptor() == Atom::TIMESTAMP) {
        if (rhs[0].getDescriptor() == Atom::TIMESTAMP) {
            index = context.setTimestampResult(Utils::GetTimestamp(&lhs[0]) - Utils::GetTimestamp(&rhs[0]));
            return true;
        } else if (rhs[0].isFloat()) {
            if (rhs[0] != Atom::PlusInfinity()) {
                index = context.setTimestampResult(Utils::GetTimestamp(&lhs[0]) - rhs[0].asFloat());
                return true;
            }
        }
    }

    index = context.setAtomicResult(Atom::Nil());
    return false;
}